

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O2

RegEx * YAML::Exp::Hex(void)

{
  int iVar1;
  RegEx *ex1;
  RegEx RStack_68;
  RegEx local_48;
  RegEx local_28;
  
  if (Hex()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&Hex()::e);
    if (iVar1 != 0) {
      ex1 = Digit();
      RegEx::RegEx(&local_48,'A','F');
      operator|(&local_28,ex1,&local_48);
      RegEx::RegEx(&RStack_68,'a','f');
      operator|(&Hex::e,&local_28,&RStack_68);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&RStack_68.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_28.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_48.m_params);
      __cxa_atexit(RegEx::~RegEx,&Hex::e,&__dso_handle);
      __cxa_guard_release(&Hex()::e);
    }
  }
  return &Hex::e;
}

Assistant:

inline const RegEx& Hex() {
  static const RegEx e = Digit() | RegEx('A', 'F') | RegEx('a', 'f');
  return e;
}